

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.tab.hh
# Opt level: O2

shared_ptr<tchecker::lvalue_expression_t> * __thiscall
tchecker::parsing::program::parser_t::value_type::as<std::shared_ptr<tchecker::lvalue_expression_t>>
          (value_type *this)

{
  bool bVar1;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O2/src/parsing/program_parser/program.tab.hh"
                  ,0x14f,
                  "const T &tchecker::parsing::program::parser_t::value_type::as() const [T = std::shared_ptr<tchecker::lvalue_expression_t>]"
                 );
  }
  bVar1 = std::type_info::operator==
                    (this->yytypeid_,
                     (type_info *)&std::shared_ptr<tchecker::lvalue_expression_t>::typeinfo);
  if (bVar1) {
    return (shared_ptr<tchecker::lvalue_expression_t> *)this;
  }
  __assert_fail("*yytypeid_ == typeid (T)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O2/src/parsing/program_parser/program.tab.hh"
                ,0x150,
                "const T &tchecker::parsing::program::parser_t::value_type::as() const [T = std::shared_ptr<tchecker::lvalue_expression_t>]"
               );
}

Assistant:

const T&
    as () const YY_NOEXCEPT
    {
      PPYY_ASSERT (yytypeid_);
      PPYY_ASSERT (*yytypeid_ == typeid (T));
      PPYY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }